

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O2

Vector3d * ear::toNormalisedVector3d(PolarPosition position)

{
  Vector3d *in_RDI;
  double in_stack_00000008;
  
  cart(in_RDI,in_stack_00000008,position.azimuth,1.0);
  return in_RDI;
}

Assistant:

Eigen::Vector3d toNormalisedVector3d(PolarPosition position) {
    return cart(position.azimuth, position.elevation, 1.0);
  }